

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O1

void Vec_VecPushInt(Vec_Vec_t *p,int Level,int Entry)

{
  int iVar1;
  void **ppvVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  
  if (p->nSize <= Level) {
    iVar1 = Level + 1;
    if (p->nCap <= Level) {
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,(long)iVar1 << 3);
      }
      p->pArray = ppvVar2;
      p->nCap = iVar1;
    }
    iVar5 = p->nSize;
    lVar4 = (long)iVar5;
    if (iVar5 <= Level) {
      iVar5 = (Level - iVar5) + 1;
      do {
        puVar3 = (undefined8 *)malloc(0x10);
        *puVar3 = 0;
        puVar3[1] = 0;
        p->pArray[lVar4] = puVar3;
        lVar4 = lVar4 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    p->nSize = iVar1;
  }
  if ((-1 < Level) && (Level < p->nSize)) {
    Vec_IntPush((Vec_Int_t *)p->pArray[(uint)Level],Entry);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
}

Assistant:

static inline void Vec_VecPushInt( Vec_Vec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        int i;
        Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
        for ( i = p->nSize; i < Level + 1; i++ )
            p->pArray[i] = Vec_IntAlloc( 0 );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_VecEntryInt(p, Level), Entry );
}